

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall xLearn::Trainer::CVTrain(Trainer *this)

{
  pointer ppRVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  long lVar4;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  _Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_78;
  string local_58;
  
  uVar2 = 0;
  while (uVar2 < (ulong)((long)(this->reader_list_).
                               super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->reader_list_).
                               super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    StringPrintf_abi_cxx11_(&local_58,"Cross-validation: %d/%lu:");
    Color::print_action(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_58.field_2._M_allocated_capacity = 0;
    lVar4 = 0;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    for (uVar3 = 0;
        ppRVar1 = (this->reader_list_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->reader_list_).
                              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3);
        uVar3 = uVar3 + 1) {
      if (uVar2 != uVar3) {
        std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
                  ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_58,
                   (value_type *)((long)ppRVar1 + lVar4));
      }
      lVar4 = lVar4 + 8;
    }
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_78,
               ppRVar1 + uVar2);
    if (uVar2 != 0) {
      Model::set_value(this->model_);
    }
    train(this,(vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_58,
          (vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_78);
    std::_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~_Vector_base(&local_78)
    ;
    std::_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~_Vector_base
              ((_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)&local_58);
    uVar2 = uVar2 + 1;
  }
  show_average_metric(this);
  return;
}

Assistant:

void Trainer::CVTrain() {
  // Use the i-th reader as validation Reader
  for (int i = 0; i < reader_list_.size(); ++i) {
    Color::print_action(
      StringPrintf("Cross-validation: %d/%lu:", 
        i+1, reader_list_.size())
    );
    // Get the train Reader and test Reader
    std::vector<Reader*> tr_reader;
    for (int j = 0; j < reader_list_.size(); ++j) {
      if (i == j) { continue; }
      tr_reader.push_back(reader_list_[j]);
    }
    std::vector<Reader*> te_reader;
    te_reader.push_back(reader_list_[i]);
    if (i != 0) {
      // Re-init current model parameters.
      model_->Reset();
    }
    this->train(tr_reader, te_reader);
  }
  // Average metric for cross-validation
  show_average_metric();
}